

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O1

void Image_Function::GetGaussianKernel
               (vector<float,_std::allocator<float>_> *filter,uint32_t width,uint32_t height,
               uint32_t kernelSize,float sigma)

{
  long lVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  void *__s;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  imageException *this;
  float *x;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int32_t posX;
  int iVar27;
  ushort uVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float fVar35;
  float fVar36;
  
  if ((((2 < width) && (2 < height)) && (kernelSize != 0)) &&
     (((uVar21 = kernelSize * 2, uVar21 < width && (uVar21 < height)) && (0.0 <= sigma)))) {
    uVar4 = kernelSize * 2 + 1;
    std::vector<float,_std::allocator<float>_>::resize(filter,(ulong)(height * width));
    __s = *(void **)filter;
    if (__s != *(void **)(filter + 8)) {
      memset(__s,0,((long)*(void **)(filter + 8) + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
    }
    lVar23 = (long)__s +
             (ulong)kernelSize * -4 +
             (ulong)(width >> 1) * 4 + (ulong)(((height >> 1) - kernelSize) * width) * 4;
    lVar1 = lVar23 + (ulong)(uVar4 * width) * 4;
    fVar36 = 0.0;
    lVar26 = lVar23;
    iVar24 = -kernelSize;
    do {
      lVar25 = 0;
      iVar27 = -kernelSize;
      do {
        fVar35 = expf(-(float)(iVar27 * iVar27 + iVar24 * iVar24) / (sigma + sigma));
        fVar35 = (1.0 / ((sigma + sigma) * 3.1415927)) * fVar35;
        *(float *)(lVar26 + lVar25) = fVar35;
        fVar36 = fVar36 + fVar35;
        iVar27 = iVar27 + 1;
        lVar25 = lVar25 + 4;
      } while ((ulong)uVar21 * 4 + 4 != lVar25);
      lVar26 = lVar26 + (ulong)width * 4;
      iVar24 = iVar24 + 1;
    } while (lVar26 != lVar1);
    auVar29 = vpbroadcastq_avx512f();
    auVar30 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar36)));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar22 = 0;
      do {
        auVar33 = vpbroadcastq_avx512f();
        auVar34 = vporq_avx512f(auVar33,auVar31);
        auVar33 = vporq_avx512f(auVar33,auVar32);
        uVar18 = vpcmpuq_avx512f(auVar33,auVar29,2);
        bVar19 = (byte)uVar18;
        uVar18 = vpcmpuq_avx512f(auVar34,auVar29,2);
        bVar20 = (byte)uVar18;
        uVar28 = CONCAT11(bVar20,bVar19);
        piVar2 = (int *)(lVar23 + uVar22 * 4);
        auVar33._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * piVar2[1];
        auVar33._0_4_ = (uint)(bVar19 & 1) * *piVar2;
        auVar33._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * piVar2[2];
        auVar33._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * piVar2[3];
        auVar33._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * piVar2[4];
        auVar33._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * piVar2[5];
        auVar33._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * piVar2[6];
        auVar33._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * piVar2[7];
        auVar33._32_4_ = (uint)(bVar20 & 1) * piVar2[8];
        auVar33._36_4_ = (uint)(bVar20 >> 1 & 1) * piVar2[9];
        auVar33._40_4_ = (uint)(bVar20 >> 2 & 1) * piVar2[10];
        auVar33._44_4_ = (uint)(bVar20 >> 3 & 1) * piVar2[0xb];
        auVar33._48_4_ = (uint)(bVar20 >> 4 & 1) * piVar2[0xc];
        auVar33._52_4_ = (uint)(bVar20 >> 5 & 1) * piVar2[0xd];
        auVar33._56_4_ = (uint)(bVar20 >> 6 & 1) * piVar2[0xe];
        auVar33._60_4_ = (uint)(bVar20 >> 7) * piVar2[0xf];
        auVar33 = vmulps_avx512f(auVar30,auVar33);
        puVar3 = (uint *)(lVar23 + uVar22 * 4);
        bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
        bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
        bVar12 = (bool)(bVar20 >> 1 & 1);
        bVar13 = (bool)(bVar20 >> 2 & 1);
        bVar14 = (bool)(bVar20 >> 3 & 1);
        bVar15 = (bool)(bVar20 >> 4 & 1);
        bVar16 = (bool)(bVar20 >> 5 & 1);
        bVar17 = (bool)(bVar20 >> 6 & 1);
        *puVar3 = (uint)(bVar19 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar19 & 1) * *puVar3;
        puVar3[1] = (uint)bVar5 * auVar33._4_4_ | (uint)!bVar5 * puVar3[1];
        puVar3[2] = (uint)bVar6 * auVar33._8_4_ | (uint)!bVar6 * puVar3[2];
        puVar3[3] = (uint)bVar7 * auVar33._12_4_ | (uint)!bVar7 * puVar3[3];
        puVar3[4] = (uint)bVar8 * auVar33._16_4_ | (uint)!bVar8 * puVar3[4];
        puVar3[5] = (uint)bVar9 * auVar33._20_4_ | (uint)!bVar9 * puVar3[5];
        puVar3[6] = (uint)bVar10 * auVar33._24_4_ | (uint)!bVar10 * puVar3[6];
        puVar3[7] = (uint)bVar11 * auVar33._28_4_ | (uint)!bVar11 * puVar3[7];
        puVar3[8] = (uint)(bVar20 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar20 & 1) * puVar3[8];
        puVar3[9] = (uint)bVar12 * auVar33._36_4_ | (uint)!bVar12 * puVar3[9];
        puVar3[10] = (uint)bVar13 * auVar33._40_4_ | (uint)!bVar13 * puVar3[10];
        puVar3[0xb] = (uint)bVar14 * auVar33._44_4_ | (uint)!bVar14 * puVar3[0xb];
        puVar3[0xc] = (uint)bVar15 * auVar33._48_4_ | (uint)!bVar15 * puVar3[0xc];
        puVar3[0xd] = (uint)bVar16 * auVar33._52_4_ | (uint)!bVar16 * puVar3[0xd];
        puVar3[0xe] = (uint)bVar17 * auVar33._56_4_ | (uint)!bVar17 * puVar3[0xe];
        puVar3[0xf] = (uint)(bVar20 >> 7) * auVar33._60_4_ |
                      (uint)!(bool)(bVar20 >> 7) * puVar3[0xf];
        uVar22 = uVar22 + 0x10;
      } while (((ulong)uVar4 + 0xf & 0xfffffffffffffff0) != uVar22);
      lVar23 = lVar23 + (ulong)width * 4;
    } while (lVar23 != lVar1);
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Incorrect input parameters for Gaussian filter kernel");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GetGaussianKernel( std::vector<float> & filter, uint32_t width, uint32_t height, uint32_t kernelSize, float sigma )
    {
        if( width < 3 || height < 3 || kernelSize == 0 || width < (kernelSize * 2 + 1) || height < (kernelSize * 2 + 1) || sigma < 0 )
            throw imageException( "Incorrect input parameters for Gaussian filter kernel" );

        filter.resize( width * height );

        std::fill( filter.begin(), filter.end(), 0.0f );

        static const float pi = 3.1415926536f;
        const float doubleSigma = sigma * 2;
        const float doubleSigmaPiInv = 1.0f / (doubleSigma * pi);
        const uint32_t twiceKernelSizePlusOne = 2 * kernelSize + 1;

        float * y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;
        const float * endY = y + twiceKernelSizePlusOne * width;

        float sum = 0;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;
            const int32_t posY2 = posY * posY;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x = doubleSigmaPiInv * expf( -static_cast<float>(posX * posX + posY2) / doubleSigma );
                sum += *x;
            }
        }

        const float normalization = 1.0f / sum;

        y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x *= normalization;
            }
        }
    }